

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeCommandListIsImmediate
          (ze_command_list_handle_t hCommandList,ze_bool_t *pIsImmediate)

{
  _func_void__ze_command_list_is_immediate_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_command_list_handle_t_ptr_uchar_ptr *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  ulong *puVar5;
  long lVar6;
  uchar *in_RSI;
  _ze_command_list_handle_t *in_RDI;
  ulong uVar7;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_command_list_is_immediate_params_t tracerParams;
  uchar *local_d8;
  _ze_command_list_handle_t *local_d0;
  _func_void__ze_command_list_is_immediate_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *local_c8
  ;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_c0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_90;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_78;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_60;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_50;
  _ze_command_list_is_immediate_params_t local_40;
  
  if (DAT_0017f448 == (_func__ze_result_t__ze_command_list_handle_t_ptr_uchar_ptr *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_d8 = in_RSI;
    local_d0 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar4 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_0017f448)(local_d0,local_d8);
      return _Var2;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar4 = '\x01';
    local_40.phCommandList = &local_d0;
    local_40.ppIsImmediate = &local_d8;
    local_a8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_c0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_c0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_c8 = (_func_void__ze_command_list_is_immediate_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    vStack_c0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    puVar5 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar5 != (ulong *)0x0) && (*puVar5 != 0)) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_50.current_api_callback =
             *(_func_void__ze_command_list_is_immediate_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)(puVar5[1] + 0x340 + lVar6);
        p_Var1 = *(_func_void__ze_command_list_is_immediate_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)(puVar5[1] + 0x998 + lVar6);
        local_50.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        if (vStack_c0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            vStack_c0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>>>
                      *)&vStack_c0,
                     (iterator)
                     vStack_c0.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          (vStack_c0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               local_50.current_api_callback;
          (vStack_c0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_50.pUserData;
          vStack_c0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_c0.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_60.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        local_60.current_api_callback = p_Var1;
        if (local_a8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_a8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>>>
                      *)&local_a8,
                     (iterator)
                     local_a8.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_60);
        }
        else {
          (local_a8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
          (local_a8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_60.pUserData;
          local_a8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_a8.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0xcb8;
      } while (uVar7 < *puVar5);
    }
    p_Var1 = local_c8;
    zeApiPtr = DAT_0017f448;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_78,&vStack_c0);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_90,&local_a8);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,unsigned_char*),_ze_command_list_is_immediate_params_t*,void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_is_immediate_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,unsigned_char*&>
                      (zeApiPtr,&local_40,p_Var1,&local_78,&local_90,local_40.phCommandList,
                       local_40.ppIsImmediate);
    if (local_90.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_c0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_c0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_c0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_c0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_is_immediate_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListIsImmediate(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_bool_t* pIsImmediate                         ///< [out] Boolean indicating whether the command list is an immediate
                                                        ///< command list (true) or not (false)
        )
    {
        auto pfnIsImmediate = context.zeDdiTable.CommandList.pfnIsImmediate;

        if( nullptr == pfnIsImmediate)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnIsImmediate, hCommandList, pIsImmediate);

        // capture parameters
        ze_command_list_is_immediate_params_t tracerParams = {
            &hCommandList,
            &pIsImmediate
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListIsImmediateCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListIsImmediateCb_t, CommandList, pfnIsImmediateCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnIsImmediate,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.ppIsImmediate);
    }